

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseSnapshot.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
DatabaseSnapshot::find_compact_candidate_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,DatabaseSnapshot *this,bool smart)

{
  OnDiskDataset *pOVar1;
  OnDiskDataset *pOVar2;
  ulong uVar3;
  source_loc loc;
  source_loc loc_00;
  iterator iVar4;
  bool bVar5;
  OnDiskDataset **candidate_1;
  uint64_t uVar6;
  _Alloc_hider __args;
  OnDiskDataset **ppOVar7;
  ulong uVar8;
  long lVar9;
  logger *plVar10;
  undefined7 in_register_00000011;
  OnDiskDataset **candidate;
  iterator iVar11;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *__n;
  ulong uVar12;
  pointer datasets;
  OnDiskDataset **ppOVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  OnDiskDataset **ppOVar15;
  __normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
  __i;
  long lVar16;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  string_view dataset_id;
  string_view_t fmt;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> ready_candidates;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *names;
  int64_t best_compact_value;
  OnDiskDataset **local_f8;
  OnDiskDataset **local_f0;
  OnDiskDataset **local_e8;
  iterator iStack_e0;
  OnDiskDataset **local_d8;
  ConfigKey local_c8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  pointer local_80;
  long local_78;
  undefined4 local_6c;
  OnDiskDataset **local_68;
  uint64_t local_60;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *local_58;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *local_50;
  vector<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
  local_48;
  
  local_6c = (undefined4)CONCAT71(in_register_00000011,smart);
  local_90 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__;
  ConfigKey::merge_max_datasets();
  uVar6 = DatabaseConfig::get(&this->config,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.key_._M_dataplus._M_p != &local_c8.key_.field_2) {
    operator_delete(local_c8.key_._M_dataplus._M_p,local_c8.key_.field_2._M_allocated_capacity + 1);
  }
  ConfigKey::merge_max_files();
  local_60 = DatabaseConfig::get(&this->config,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.key_._M_dataplus._M_p != &local_c8.key_.field_2) {
    operator_delete(local_c8.key_._M_dataplus._M_p,local_c8.key_.field_2._M_allocated_capacity + 1);
  }
  local_78 = -0x8000000000000000;
  OnDiskDataset::get_compatible_datasets(&local_48,&this->datasets);
  local_58 = local_48.
             super__Vector_base<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super__Vector_base<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_48.
      super__Vector_base<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
    ::~vector(&local_48);
    ppOVar13 = (OnDiskDataset **)0x0;
    iVar11._M_current = (OnDiskDataset **)0x0;
    local_f0 = (OnDiskDataset **)0x0;
  }
  else {
    local_f8 = (OnDiskDataset **)0x0;
    iVar11._M_current = (OnDiskDataset **)0x0;
    datasets = local_48.
               super__Vector_base<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppOVar15 = (OnDiskDataset **)0x0;
    do {
      local_68 = iVar11._M_current;
      local_50 = datasets;
      if ((char)local_6c == '\0') {
        __args._M_p = (pointer)(datasets->
                               super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                               )._M_impl.super__Vector_impl_data._M_start;
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(datasets->
                     super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
        local_80 = (datasets->
                   super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                   )._M_impl.super__Vector_impl_data._M_end_of_storage;
        (datasets->super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (datasets->super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (datasets->super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      else {
        OnDiskDataset::get_compact_candidates
                  ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                   &local_c8,datasets);
        local_80 = (pointer)local_c8.key_.field_2._M_allocated_capacity;
        __args._M_p = local_c8.key_._M_dataplus._M_p;
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8.key_._M_string_length;
      }
      local_e8 = (OnDiskDataset **)0x0;
      iStack_e0._M_current = (OnDiskDataset **)0x0;
      local_d8 = (OnDiskDataset **)0x0;
      local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)__args._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__args._M_p == paVar14) {
LAB_00131174:
        uVar12 = 0;
      }
      else {
        do {
          OnDiskDataset::get_id_abi_cxx11_(&local_c8.key_,*(OnDiskDataset **)__args._M_p);
          dataset_id._M_str = local_c8.key_._M_dataplus._M_p;
          dataset_id._M_len = local_c8.key_._M_string_length;
          bVar5 = is_dataset_locked(&this->tasks,dataset_id);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8.key_._M_dataplus._M_p != &local_c8.key_.field_2) {
            operator_delete(local_c8.key_._M_dataplus._M_p,
                            local_c8.key_.field_2._M_allocated_capacity + 1);
          }
          if (!bVar5) {
            if (iStack_e0._M_current == local_d8) {
              std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>::
              _M_realloc_insert<OnDiskDataset_const*const&>
                        ((vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>> *)
                         &local_e8,iStack_e0,(OnDiskDataset **)__args._M_p);
            }
            else {
              *iStack_e0._M_current = *(OnDiskDataset **)__args._M_p;
              iStack_e0._M_current = iStack_e0._M_current + 1;
            }
          }
          iVar11._M_current = iStack_e0._M_current;
          ppOVar13 = local_e8;
          __args._M_p = __args._M_p + 8;
        } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)__args._M_p != paVar14);
        if (local_e8 == iStack_e0._M_current) goto LAB_00131174;
        uVar12 = 0;
        ppOVar7 = local_e8;
        do {
          uVar12 = uVar12 + ((*ppOVar7)->files_index).
                            super__Optional_base<OnDiskFileIndex,_false,_false>._M_payload.
                            super__Optional_payload<OnDiskFileIndex,_true,_false,_false>.
                            super__Optional_payload_base<OnDiskFileIndex>._M_payload._M_value.
                            file_count;
          ppOVar7 = ppOVar7 + 1;
        } while (ppOVar7 != iStack_e0._M_current);
        if (local_e8 != iStack_e0._M_current) {
          lVar16 = (long)iStack_e0._M_current - (long)local_e8;
          uVar8 = lVar16 >> 3;
          lVar9 = 0x3f;
          if (uVar8 != 0) {
            for (; uVar8 >> lVar9 == 0; lVar9 = lVar9 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<OnDiskDataset_const**,std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<DatabaseSnapshot::find_compact_candidate[abi:cxx11](bool)const::__0>>
                    (local_e8,iStack_e0._M_current,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
          if (lVar16 < 0x81) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<OnDiskDataset_const**,std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<DatabaseSnapshot::find_compact_candidate[abi:cxx11](bool)const::__0>>
                      (ppOVar13,iVar11._M_current);
          }
          else {
            ppOVar7 = ppOVar13 + 0x10;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<OnDiskDataset_const**,std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<DatabaseSnapshot::find_compact_candidate[abi:cxx11](bool)const::__0>>
                      (ppOVar13,ppOVar7);
            for (; ppOVar7 != iVar11._M_current; ppOVar7 = ppOVar7 + 1) {
              pOVar1 = ppOVar7[-1];
              pOVar2 = *ppOVar7;
              uVar8 = (pOVar2->files_index).super__Optional_base<OnDiskFileIndex,_false,_false>.
                      _M_payload.super__Optional_payload<OnDiskFileIndex,_true,_false,_false>.
                      super__Optional_payload_base<OnDiskFileIndex>._M_payload._M_value.file_count;
              uVar3 = (pOVar1->files_index).super__Optional_base<OnDiskFileIndex,_false,_false>.
                      _M_payload.super__Optional_payload<OnDiskFileIndex,_true,_false,_false>.
                      super__Optional_payload_base<OnDiskFileIndex>._M_payload._M_value.file_count;
              ppOVar13 = ppOVar7;
              while (uVar8 < uVar3) {
                *ppOVar13 = pOVar1;
                pOVar1 = ppOVar13[-2];
                ppOVar13 = ppOVar13 + -1;
                uVar3 = (pOVar1->files_index).super__Optional_base<OnDiskFileIndex,_false,_false>.
                        _M_payload.super__Optional_payload<OnDiskFileIndex,_true,_false,_false>.
                        super__Optional_payload_base<OnDiskFileIndex>._M_payload._M_value.file_count
                ;
              }
              *ppOVar13 = pOVar2;
            }
          }
        }
      }
      local_f0 = local_d8;
      ppOVar13 = local_e8;
      uVar8 = (long)iStack_e0._M_current - (long)local_e8 >> 3;
      if ((uVar6 < uVar8) || (local_60 < uVar12)) {
        lVar9 = (long)(iStack_e0._M_current + -1) - (long)local_e8;
        ppOVar7 = iStack_e0._M_current + -1;
        do {
          do {
            iStack_e0._M_current = ppOVar7;
            uVar12 = uVar12 - ((*iStack_e0._M_current)->files_index).
                              super__Optional_base<OnDiskFileIndex,_false,_false>._M_payload.
                              super__Optional_payload<OnDiskFileIndex,_true,_false,_false>.
                              super__Optional_payload_base<OnDiskFileIndex>._M_payload._M_value.
                              file_count;
            uVar8 = lVar9 >> 3;
            lVar9 = lVar9 + -8;
            ppOVar7 = iStack_e0._M_current + -1;
          } while (uVar6 < uVar8);
        } while (local_60 < uVar12);
      }
      iVar4._M_current = iStack_e0._M_current;
      iVar11._M_current = local_68;
      if ((uVar8 < 2) || (lVar9 = uVar8 - uVar12 / uVar8, lVar9 <= local_78)) {
LAB_00131248:
        local_f0 = ppOVar15;
        ppOVar13 = local_f8;
        if (local_e8 != (OnDiskDataset **)0x0) {
          operator_delete(local_e8,(long)local_d8 - (long)local_e8);
        }
      }
      else {
        local_e8 = (OnDiskDataset **)0x0;
        iStack_e0._M_current = (OnDiskDataset **)0x0;
        local_d8 = (OnDiskDataset **)0x0;
        iVar11._M_current = iVar4._M_current;
        local_78 = lVar9;
        if (local_f8 != (OnDiskDataset **)0x0) {
          operator_delete(local_f8,(long)ppOVar15 - (long)local_f8);
          local_f8 = ppOVar13;
          ppOVar15 = local_f0;
          goto LAB_00131248;
        }
      }
      if (local_88 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_88,(long)local_80 - (long)local_88);
      }
      datasets = local_50 + 1;
      ppOVar15 = local_f0;
      local_f8 = ppOVar13;
    } while (datasets != local_58);
    std::
    vector<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
    ::~vector(&local_48);
    if (ppOVar13 != iVar11._M_current) {
      __n = (vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
            ((long)iVar11._M_current - (long)ppOVar13 >> 3);
      local_48.
      super__Vector_base<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = __n;
      plVar10 = spdlog::default_logger_raw();
      this_00 = local_90;
      local_c8.key_._M_dataplus._M_p = (pointer)0x0;
      local_c8.key_._M_string_length = 0;
      local_c8.key_.field_2._M_allocated_capacity = 0;
      loc.funcname = (char *)0x0;
      loc.filename = (char *)0x0;
      loc.line = 0;
      loc._12_4_ = 0;
      fmt.size_ = 0x28;
      fmt.data_ = "Good candidate (cost: {}, datasets: {}).";
      spdlog::logger::log<long,unsigned_long>
                (plVar10,loc,debug,fmt,&local_78,(unsigned_long *)&local_48);
      bVar5 = false;
      goto LAB_00131393;
    }
  }
  this_00 = local_90;
  plVar10 = spdlog::default_logger_raw();
  local_c8.key_._M_dataplus._M_p = (pointer)0x0;
  local_c8.key_._M_string_length = 0;
  local_c8.key_.field_2._M_allocated_capacity = 0;
  loc_00.funcname = (char *)0x0;
  loc_00.filename = (char *)0x0;
  loc_00.line = 0;
  loc_00._12_4_ = 0;
  spdlog::logger::log<char[37],_nullptr>
            (plVar10,loc_00,debug,(char (*) [37])"No suitable compact candidate found.");
  __n = (vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
        ((long)iVar11._M_current - (long)ppOVar13 >> 3);
  bVar5 = true;
LAB_00131393:
  *(undefined8 *)this_00 = 0;
  *(undefined8 *)(this_00 + 8) = 0;
  *(undefined8 *)(this_00 + 0x10) = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_00,(size_type)__n);
  if (!bVar5) {
    ppOVar15 = ppOVar13;
    do {
      OnDiskDataset::get_id_abi_cxx11_(&local_c8.key_,*ppOVar15);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(this_00,&local_c8.key_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.key_._M_dataplus._M_p != &local_c8.key_.field_2) {
        operator_delete(local_c8.key_._M_dataplus._M_p,
                        local_c8.key_.field_2._M_allocated_capacity + 1);
      }
      ppOVar15 = ppOVar15 + 1;
    } while (ppOVar15 != iVar11._M_current);
  }
  if (ppOVar13 != (OnDiskDataset **)0x0) {
    operator_delete(ppOVar13,(long)local_f0 - (long)ppOVar13);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this_00;
}

Assistant:

std::vector<std::string> DatabaseSnapshot::find_compact_candidate(
    bool smart) const {
    const uint64_t max_datasets = config.get(ConfigKey::merge_max_datasets());
    const uint64_t max_files = config.get(ConfigKey::merge_max_files());

    // Try to find a best compact candidate. As a rating function, we use
    // "number of datasets" - "average number of files", because we want to
    // maximise number of datasets being compacted and minimise number of
    // files being compacted (we want to compact small datasets first).
    std::vector<const OnDiskDataset *> best_compact;
    int64_t best_compact_value = std::numeric_limits<int64_t>::min();
    for (auto &set : OnDiskDataset::get_compatible_datasets(datasets)) {
        // Check every set of compatible datasets.
        std::vector<const OnDiskDataset *> candidates;
        if (smart) {
            // When we're trying to be smart, ignore too small sets.
            candidates = std::move(OnDiskDataset::get_compact_candidates(set));
        } else {
            candidates = std::move(set);
        }

        // Ignore datasets that are locked.
        std::vector<const OnDiskDataset *> ready_candidates;
        for (const auto &candidate : candidates) {
            if (!is_dataset_locked(tasks, candidate->get_id())) {
                ready_candidates.push_back(candidate);
            }
        }

        // Compute number of files in this dataset.
        uint64_t number_of_files = 0;
        for (const auto &candidate : ready_candidates) {
            number_of_files += candidate->get_file_count();
        }

        // Check for allowed maximum merge values. If they are exceeded, try to
        // merge small datasets first.
        std::sort(ready_candidates.begin(), ready_candidates.end(),
                  [](const auto &lhs, const auto &rhs) {
                      return lhs->get_file_count() < rhs->get_file_count();
                  });
        while (ready_candidates.size() > max_datasets ||
               number_of_files > max_files) {
            number_of_files -= ready_candidates.back()->get_file_count();
            ready_candidates.pop_back();
        }

        // It doesn't make sense to merge less than 2 datasets.
        if (ready_candidates.size() < 2) {
            continue;
        }

        // Compute compact_value for this set, and maybe update best candidate.
        uint64_t avg_files = number_of_files / ready_candidates.size();
        int64_t compact_value = ready_candidates.size() - avg_files;
        if (compact_value > best_compact_value) {
            best_compact_value = compact_value;
            best_compact = std::move(ready_candidates);
        }
    }

    if (best_compact.empty()) {
        spdlog::debug("No suitable compact candidate found.");
    } else {
        spdlog::debug("Good candidate (cost: {}, datasets: {}).",
                      best_compact_value, best_compact.size());
    }

    std::vector<std::string> names;
    names.reserve(best_compact.size());
    for (const auto &ds : best_compact) {
        names.emplace_back(ds->get_id());
    }

    return names;
}